

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::HasItem
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,uint32 index)

{
  bool bVar1;
  uint uVar2;
  IndexPropertyDescriptor *in_RAX;
  IndexPropertyDescriptor *local_28;
  IndexPropertyDescriptor *descriptor;
  
  local_28 = in_RAX;
  bVar1 = IndexPropertyDescriptorMap::TryGetReference((this->indexPropertyMap).ptr,index,&local_28);
  if (bVar1) {
    uVar2 = (uint)((local_28->Attributes & 8) == 0);
  }
  else {
    uVar2 = HasDataItem(this,arr,index);
  }
  return uVar2;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::HasItem(ES5Array* arr, uint32 index)
    {
        // We have the item if we have its descriptor.
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            return !(descriptor->Attributes & PropertyDeleted);
        }

        // Otherwise check if we have such a data item.
        return HasDataItem(arr, index);
    }